

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvmodelserialiser.cpp
# Opt level: O0

QString * __thiscall
CsvModelSerialiserPrivate::escapedCSV
          (QString *__return_storage_ptr__,CsvModelSerialiserPrivate *this,QString *unexc)

{
  bool bVar1;
  QString *b;
  QLatin1Char local_9d [13];
  QArrayDataPointer<char16_t> local_90;
  QString local_78;
  QLatin1Char local_5d;
  QChar local_5c;
  QLatin1Char local_59;
  QStringBuilder<QLatin1Char,_QString> local_58;
  QStringBuilder<QStringBuilder<QLatin1Char,_QString>,_QLatin1Char> local_48;
  QString *local_38;
  QString *unexc_local;
  CsvModelSerialiserPrivate *this_local;
  char16_t *local_20;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_10;
  
  local_38 = unexc;
  unexc_local = (QString *)this;
  this_local = (CsvModelSerialiserPrivate *)__return_storage_ptr__;
  bVar1 = QString::contains(unexc,&this->m_csvSeparator,CaseSensitive);
  if (bVar1) {
    QLatin1Char::QLatin1Char(&local_59,'\"');
    QLatin1Char::QLatin1Char(&local_5d,'\"');
    QChar::QChar(&local_5c,local_5d);
    str = L"\"\"";
    local_20 = L"\"\"";
    local_10 = &local_90;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_90,(Data *)0x0,L"\"\"",2);
    QString::QString(&local_78,&local_90);
    b = (QString *)
        QString::replace((QChar *)unexc,(QString *)(ulong)(ushort)local_5c.ucs,
                         (CaseSensitivity)&local_78);
    local_58 = operator%(&local_59,b);
    QLatin1Char::QLatin1Char(local_9d,'\"');
    local_48 = operator%(&local_58,local_9d);
    QStringBuilder::operator_cast_to_QString(__return_storage_ptr__,(QStringBuilder *)&local_48);
    QString::~QString(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  }
  else {
    QString::QString(__return_storage_ptr__,unexc);
  }
  return __return_storage_ptr__;
}

Assistant:

QString CsvModelSerialiserPrivate::escapedCSV(QString unexc) const
{
    if (!unexc.contains(m_csvSeparator))
        return unexc;
    return QLatin1Char('\"') % unexc.replace(QLatin1Char('\"'), QStringLiteral("\"\"")) % QLatin1Char('\"');
}